

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
::~Parser(Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
          *this)

{
  MapEntryImpl<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *pMVar1;
  ulong uVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  pMVar1 = this->entry_;
  if (pMVar1 != (MapEntryImpl<CoreML::Specification::StringToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 *)0x0) {
    uVar2 = (pMVar1->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    if (puVar4 == (undefined8 *)0x0) {
      (*(pMVar1->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  pcVar3 = (this->key_)._M_dataplus._M_p;
  paVar5 = &(this->key_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Parser() {
      if (entry_ != nullptr && entry_->GetArenaForAllocation() == nullptr)
        delete entry_;
    }